

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceFieldTest_TestLong_Test::TestBody
          (PriceFieldTest_TestLong_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_120;
  Message local_118 [2];
  logic_error *anon_var_0_2;
  byte local_e1;
  char *pcStack_e0;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  Message local_d0 [2];
  logic_error *anon_var_0_1;
  char *pcStack_b8;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_a8 [2];
  logic_error *anon_var_0;
  char *pcStack_90;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_80;
  long local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58 [3];
  Type local_40 [2];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  PriceField field;
  long local_18;
  int64_t value;
  PriceFieldTest_TestLong_Test *this_local;
  
  local_18 = 0x85e0b0cba7;
  value = (int64_t)this;
  bidfx_public_api::price::PriceField::PriceField((PriceField *)&gtest_ar.message_,0x85e0b0cba7);
  local_40[1] = 1;
  local_40[0] = bidfx_public_api::price::PriceField::GetType();
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((EqHelper<false> *)local_38,"PriceField::LONG","field.GetType()",local_40 + 1,local_40)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_78 = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_70,"value","field.GetLong()",&local_18,&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff70,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff70);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bidfx_public_api::price::PriceField::GetInt();
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_90 = 
      "Expected: field.GetInt() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
      ;
      goto LAB_0025086a;
    }
  }
  else {
LAB_0025086a:
    testing::Message::Message(local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x28,pcStack_90);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(local_a8);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff48,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff48);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bidfx_public_api::price::PriceField::GetDouble();
    }
    if ((anon_var_0_1._7_1_ & 1) == 0) {
      pcStack_b8 = 
      "Expected: field.GetDouble() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
      ;
      goto LAB_002509f0;
    }
  }
  else {
LAB_002509f0:
    testing::Message::Message(local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x29,pcStack_b8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_2,local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_2);
    testing::Message::~Message(local_d0);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff20,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff20);
  if (bVar1) {
    local_e1 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
      std::__cxx11::string::~string((string *)&anon_var_0_2);
    }
    if ((local_e1 & 1) != 0) goto LAB_00250c20;
    pcStack_e0 = 
    "Expected: field.GetString() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_118);
  testing::internal::AssertHelper::AssertHelper
            (&local_120,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
             ,0x2a,pcStack_e0);
  testing::internal::AssertHelper::operator=(&local_120,local_118);
  testing::internal::AssertHelper::~AssertHelper(&local_120);
  testing::Message::~Message(local_118);
LAB_00250c20:
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(PriceFieldTest, TestLong)
{
    int64_t value = 575000333223;
    PriceField field = PriceField(value);
    EXPECT_EQ(PriceField::LONG, field.GetType());
    EXPECT_EQ(value, field.GetLong());
    EXPECT_THROW(field.GetInt(), std::logic_error);
    EXPECT_THROW(field.GetDouble(), std::logic_error);
    EXPECT_THROW(field.GetString(), std::logic_error);
}